

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall ObjectTest_set_bool_Test::TestBody(ObjectTest_set_bool_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_268 [8];
  Message local_260 [8];
  int local_258;
  int local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_220 [8];
  Message local_218 [15];
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1d8 [8];
  Message local_1d0 [15];
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_190 [8];
  Message local_188 [15];
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__3;
  Message local_160 [8];
  int local_158;
  int local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  AssertHelper local_120 [8];
  Message local_118 [15];
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_d8 [8];
  Message local_d0 [15];
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_90 [8];
  Message local_88 [15];
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  undefined1 local_58 [8];
  object obj;
  ObjectTest_set_bool_Test *this_local;
  
  jessilib::object::object((object *)local_58);
  jessilib::object::set<bool,_nullptr>((object *)local_58,true);
  local_79 = jessilib::object::has<bool>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_78,"obj.has<bool>()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x353,pcVar2);
    testing::internal::AssertHelper::operator=(local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_c1 = jessilib::object::get<bool,_nullptr>((object *)local_58,false);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_c0,"obj.get<bool>()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x354,pcVar2);
    testing::internal::AssertHelper::operator=(local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  bVar1 = jessilib::object::has<int>((object *)local_58);
  local_109 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_108,"obj.has<int>()","true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x355,pcVar2);
    testing::internal::AssertHelper::operator=(local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(local_120);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_154 = jessilib::object::get<int,_nullptr>((object *)local_58,0);
  local_158 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_150,"obj.get<int>()","0",&local_154,&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x356,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  jessilib::object::set<bool,_nullptr>((object *)local_58,false);
  local_179 = jessilib::object::has<bool>((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_178,&local_179,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__4.message_,local_178,"obj.has<bool>()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x35a,pcVar2);
    testing::internal::AssertHelper::operator=(local_190,local_188);
    testing::internal::AssertHelper::~AssertHelper(local_190);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  bVar1 = jessilib::object::get<bool,_nullptr>((object *)local_58,false);
  local_1c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__5.message_,local_1c0,"obj.get<bool>()","true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar__5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x35b,pcVar2);
    testing::internal::AssertHelper::operator=(local_1d8,local_1d0);
    testing::internal::AssertHelper::~AssertHelper(local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  bVar1 = jessilib::object::has<int>((object *)local_58);
  local_209 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_208,&local_209,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_208,"obj.has<int>()","true");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x35c,pcVar2);
    testing::internal::AssertHelper::operator=(local_220,local_218);
    testing::internal::AssertHelper::~AssertHelper(local_220);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_254 = jessilib::object::get<int,_nullptr>((object *)local_58,0);
  local_258 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_250,"obj.get<int>()","0",&local_254,&local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              (local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x35d,pcVar2);
    testing::internal::AssertHelper::operator=(local_268,local_260);
    testing::internal::AssertHelper::~AssertHelper(local_268);
    testing::Message::~Message(local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  jessilib::object::~object((object *)local_58);
  return;
}

Assistant:

TEST(ObjectTest, set_bool) {
	object obj;

	obj.set(true);

	EXPECT_TRUE(obj.has<bool>());
	EXPECT_TRUE(obj.get<bool>());
	EXPECT_FALSE(obj.has<int>());
	EXPECT_EQ(obj.get<int>(), 0);

	obj.set(false);

	EXPECT_TRUE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());
	EXPECT_FALSE(obj.has<int>());
	EXPECT_EQ(obj.get<int>(), 0);
}